

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm_compiled_light.cpp
# Opt level: O0

void __thiscall
randomx::CompiledLightVm<randomx::AlignedAllocator<64UL>,_true,_true>::run
          (CompiledLightVm<randomx::AlignedAllocator<64UL>,_true,_true> *this,void *seed)

{
  ProgramConfiguration *in_RSI;
  Program *in_RDI;
  JitCompilerX86 *unaff_retaddr;
  randomx_vm *in_stack_00000040;
  uint32_t datasetOffset;
  Program *prog;
  
  prog = in_RDI;
  VmBase<randomx::AlignedAllocator<64UL>,_true>::generateProgram
            ((VmBase<randomx::AlignedAllocator<64UL>,_true> *)in_RSI,in_RDI);
  datasetOffset = (uint32_t)((ulong)in_RDI >> 0x20);
  randomx_vm::initialize(in_stack_00000040);
  JitCompilerX86::enableWriting((JitCompilerX86 *)0x13b40a);
  JitCompilerX86::generateProgramLight(unaff_retaddr,prog,in_RSI,datasetOffset);
  JitCompilerX86::enableExecution((JitCompilerX86 *)0x13b447);
  CompiledVm<randomx::AlignedAllocator<64UL>,_true,_true>::execute
            ((CompiledVm<randomx::AlignedAllocator<64UL>,_true,_true> *)in_RSI);
  return;
}

Assistant:

void CompiledLightVm<Allocator, softAes, secureJit>::run(void* seed) {
		VmBase<Allocator, softAes>::generateProgram(seed);
		randomx_vm::initialize();
		if (secureJit) {
			compiler.enableWriting();
		}
		compiler.generateProgramLight(program, config, datasetOffset);
		if (secureJit) {
			compiler.enableExecution();
		}
		CompiledVm<Allocator, softAes, secureJit>::execute();
	}